

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_ssi_filter_module.c
# Opt level: O1

ngx_int_t ngx_http_ssi_if(ngx_http_request_t *r,ngx_http_ssi_ctx_t *ctx,ngx_str_t **params)

{
  ngx_log_t *pnVar1;
  byte *__s1;
  byte bVar2;
  int iVar3;
  ngx_int_t nVar4;
  long lVar5;
  char *in_RCX;
  ngx_str_t *pnVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  bool bVar10;
  undefined1 local_60 [8];
  ngx_str_t right;
  ngx_str_t left;
  
  if (((ctx->command).len == 2) && ((ctx->field_0x1a0 & 3) != 0)) {
    pnVar1 = r->connection->log;
    if (3 < pnVar1->log_level) {
      ngx_log_error_core(4,pnVar1,0,"the \"if\" command inside the \"if\" command");
      return 1;
    }
    return 1;
  }
  if ((ctx->field_0x1a0 & 0x40) != 0) {
    ctx->field_0x1a0 = ctx->field_0x1a0 & 0xdf;
    return 0;
  }
  pnVar6 = *params;
  pnVar1 = r->connection->log;
  if ((pnVar1->log_level & 0x100) != 0) {
    in_RCX = "ssi if expr=\"%V\"";
    ngx_log_error_core(8,pnVar1,0,"ssi if expr=\"%V\"",pnVar6);
  }
  pbVar8 = pnVar6->data + pnVar6->len;
  __s1 = pnVar6->data;
  for (pbVar7 = __s1; pbVar7 < pbVar8; pbVar7 = pbVar7 + 1) {
    bVar2 = *pbVar7;
    in_RCX = (char *)(ulong)bVar2;
    if ((byte)(bVar2 + 0xbf) < 0x1a) {
      in_RCX = (char *)(ulong)(bVar2 | 0x20);
      *pbVar7 = bVar2 | 0x20;
    }
    else if ((9 < (byte)(bVar2 - 0x30) && 0x19 < (byte)(bVar2 + 0x9f)) &&
            ((((0x3d < bVar2 - 0x22 ||
               ((0x2000000000000025U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0)) &&
              (bVar2 != 0x7d)) && (bVar2 != 0x7b)))) break;
  }
  right.data = pbVar7 + -(long)__s1;
  bVar9 = pbVar7 < pbVar8;
  if (bVar9) {
    bVar2 = *pbVar7;
    while (bVar2 == 0x20) {
      pbVar7 = pbVar7 + 1;
      bVar9 = pbVar7 < pbVar8;
      if (!bVar9) break;
      bVar2 = *pbVar7;
    }
  }
  pnVar1 = r->connection->log;
  if ((pnVar1->log_level & 0x100) != 0) {
    in_RCX = "left: \"%V\"";
    ngx_log_error_core(8,pnVar1,0,"left: \"%V\"",&right.data);
  }
  nVar4 = ngx_http_ssi_evaluate_string
                    (r,(ngx_http_ssi_ctx_t *)&right.data,(ngx_str_t *)0x0,(ngx_uint_t)in_RCX);
  if (nVar4 != 0) {
    return nVar4;
  }
  pnVar1 = r->connection->log;
  if ((pnVar1->log_level & 0x100) != 0) {
    in_RCX = "evaluated left: \"%V\"";
    ngx_log_error_core(8,pnVar1,0,"evaluated left: \"%V\"",&right.data);
  }
  if (pbVar7 == pbVar8) {
    bVar2 = ctx->field_0x1a0 | 0x60;
    if (right.data == (u_char *)0x0) {
      bVar2 = ctx->field_0x1a0 & 0xdc;
    }
    ctx->field_0x1a0 = (bVar2 & 0xfc) + 1;
    return 0;
  }
  if ((bVar9) && (*pbVar7 == 0x3d)) {
    bVar9 = true;
    lVar5 = 1;
  }
  else {
    if ((pbVar8 <= pbVar7 + 1) || ((*pbVar7 != 0x21 || (pbVar7[1] != 0x3d)))) goto LAB_0015e3c9;
    lVar5 = 2;
    bVar9 = false;
  }
  for (right.len = (size_t)(pbVar7 + lVar5); (right.len < pbVar8 && (*(byte *)right.len == 0x20));
      right.len = right.len + 1) {
  }
  pbVar7 = pbVar8 + -1;
  if (right.len < pbVar7) {
    bVar2 = *(byte *)right.len;
    in_RCX = (char *)(ulong)bVar2;
    if (bVar2 == 0x5c) {
      if (*(byte *)(right.len + 1) == 0x2f) {
        right.len = (size_t)(right.len + 1);
      }
    }
    else if (bVar2 == 0x2f) {
      if (*pbVar7 != 0x2f) {
LAB_0015e3c9:
        pnVar1 = r->connection->log;
        if (3 < pnVar1->log_level) {
          ngx_log_error_core(4,pnVar1,0,"invalid expression in \"%V\"",pnVar6);
          return 1;
        }
        return 1;
      }
      right.len = right.len + 1;
      pnVar6 = (ngx_str_t *)0x2;
      in_RCX = (char *)0x1;
      bVar10 = true;
      pbVar8 = pbVar7;
      goto LAB_0015e40a;
    }
  }
  bVar10 = false;
  pnVar6 = (ngx_str_t *)0x0;
LAB_0015e40a:
  local_60 = (undefined1  [8])(pbVar8 + -right.len);
  pnVar1 = r->connection->log;
  if ((pnVar1->log_level & 0x100) != 0) {
    in_RCX = "right: \"%V\"";
    ngx_log_error_core(8,pnVar1,0,"right: \"%V\"",local_60);
  }
  nVar4 = ngx_http_ssi_evaluate_string(r,(ngx_http_ssi_ctx_t *)local_60,pnVar6,(ngx_uint_t)in_RCX);
  if (nVar4 == 0) {
    pnVar1 = r->connection->log;
    if ((pnVar1->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar1,0,"evaluated right: \"%V\"",local_60);
    }
    if (bVar10) {
      *(byte *)((long)(u_char **)local_60 + right.len) = 0;
      nVar4 = ngx_http_ssi_regex_match(r,(ngx_str_t *)local_60,(ngx_str_t *)&right.data);
      if (nVar4 == 0) {
        bVar10 = false;
      }
      else {
        if (nVar4 != -5) {
          return nVar4;
        }
        bVar10 = true;
      }
    }
    else {
      bVar10 = true;
      if ((undefined1  [8])right.data == local_60) {
        iVar3 = strncmp((char *)__s1,(char *)right.len,(size_t)local_60);
        bVar10 = iVar3 != 0;
      }
    }
    bVar2 = ctx->field_0x1a0 & 0xdc;
    if (bVar9 != bVar10) {
      bVar2 = ctx->field_0x1a0 | 0x60;
    }
    ctx->field_0x1a0 = (bVar2 & 0xfc) + 1;
    return 0;
  }
  return nVar4;
}

Assistant:

static ngx_int_t
ngx_http_ssi_if(ngx_http_request_t *r, ngx_http_ssi_ctx_t *ctx,
    ngx_str_t **params)
{
    u_char       *p, *last;
    ngx_str_t    *expr, left, right;
    ngx_int_t     rc;
    ngx_uint_t    negative, noregex, flags;

    if (ctx->command.len == 2) {
        if (ctx->conditional) {
            ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                          "the \"if\" command inside the \"if\" command");
            return NGX_HTTP_SSI_ERROR;
        }
    }

    if (ctx->output_chosen) {
        ctx->output = 0;
        return NGX_OK;
    }

    expr = params[NGX_HTTP_SSI_IF_EXPR];

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "ssi if expr=\"%V\"", expr);

    left.data = expr->data;
    last = expr->data + expr->len;

    for (p = left.data; p < last; p++) {
        if (*p >= 'A' && *p <= 'Z') {
            *p |= 0x20;
            continue;
        }

        if ((*p >= 'a' && *p <= 'z')
             || (*p >= '0' && *p <= '9')
             || *p == '$' || *p == '{' || *p == '}' || *p == '_'
             || *p == '"' || *p == '\'')
        {
            continue;
        }

        break;
    }

    left.len = p - left.data;

    while (p < last && *p == ' ') {
        p++;
    }

    flags = 0;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "left: \"%V\"", &left);

    rc = ngx_http_ssi_evaluate_string(r, ctx, &left, flags);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "evaluated left: \"%V\"", &left);

    if (p == last) {
        if (left.len) {
            ctx->output = 1;
            ctx->output_chosen = 1;

        } else {
            ctx->output = 0;
        }

        ctx->conditional = NGX_HTTP_SSI_COND_IF;

        return NGX_OK;
    }

    if (p < last && *p == '=') {
        negative = 0;
        p++;

    } else if (p + 1 < last && *p == '!' && *(p + 1) == '=') {
        negative = 1;
        p += 2;

    } else {
        goto invalid_expression;
    }

    while (p < last && *p == ' ') {
        p++;
    }

    if (p < last - 1 && *p == '/') {
        if (*(last - 1) != '/') {
            goto invalid_expression;
        }

        noregex = 0;
        flags = NGX_HTTP_SSI_ADD_ZERO;
        last--;
        p++;

    } else {
        noregex = 1;
        flags = 0;

        if (p < last - 1 && p[0] == '\\' && p[1] == '/') {
            p++;
        }
    }

    right.len = last - p;
    right.data = p;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "right: \"%V\"", &right);

    rc = ngx_http_ssi_evaluate_string(r, ctx, &right, flags);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "evaluated right: \"%V\"", &right);

    if (noregex) {
        if (left.len != right.len) {
            rc = -1;

        } else {
            rc = ngx_strncmp(left.data, right.data, right.len);
        }

    } else {
        right.data[right.len] = '\0';

        rc = ngx_http_ssi_regex_match(r, &right, &left);

        if (rc == NGX_OK) {
            rc = 0;
        } else if (rc == NGX_DECLINED) {
            rc = -1;
        } else {
            return rc;
        }
    }

    if ((rc == 0 && !negative) || (rc != 0 && negative)) {
        ctx->output = 1;
        ctx->output_chosen = 1;

    } else {
        ctx->output = 0;
    }

    ctx->conditional = NGX_HTTP_SSI_COND_IF;

    return NGX_OK;

invalid_expression:

    ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                  "invalid expression in \"%V\"", expr);

    return NGX_HTTP_SSI_ERROR;
}